

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::calculate_two_particle_correlation
          (singleParticleSpectra *this,vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer pvVar9;
  pointer pvVar10;
  long lVar11;
  int j;
  long lVar12;
  int i;
  long lVar13;
  double dVar14;
  
  iVar1 = this->order_max;
  pdVar3 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->Qn2_vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->Qn2_vector_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = this->npT;
  for (lVar13 = 0; lVar13 < iVar1; lVar13 = lVar13 + 1) {
    dVar14 = pdVar4[lVar13];
    dVar14 = (pdVar3[lVar13] * pdVar3[lVar13] + dVar14 * dVar14) - *pdVar3;
    pdVar5[lVar13] = pdVar5[lVar13] + dVar14;
    pdVar6[lVar13] = dVar14 * dVar14 + pdVar6[lVar13];
    pvVar7 = (event_Qn_diff_real->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (event_Qn_diff_imag->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (this->QnSP_diff_vector).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar10 = (this->QnSP_diff_vector_err).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (lVar12 = 0; lVar12 < iVar2; lVar12 = lVar12 + 1) {
      dVar14 = (*(double *)
                 (*(long *)&pvVar7[lVar13].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl + lVar12 * 8) * pdVar3[lVar13] +
               *(double *)
                (*(long *)&pvVar8[lVar13].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data + lVar12 * 8) * pdVar4[lVar13]) -
               *(double *)
                (*(long *)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar12 * 8);
      lVar11 = *(long *)&pvVar9[lVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data;
      *(double *)(lVar11 + lVar12 * 8) = *(double *)(lVar11 + lVar12 * 8) + dVar14;
      lVar11 = *(long *)&pvVar10[lVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data;
      *(double *)(lVar11 + lVar12 * 8) = dVar14 * dVar14 + *(double *)(lVar11 + lVar12 * 8);
    }
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_two_particle_correlation(
    vector<double> &event_Qn_real, vector<double> &event_Qn_imag,
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_imag) {
    for (int i = 0; i < order_max; i++) {
        double Q2_local =
            (event_Qn_real[i] * event_Qn_real[i]
             + event_Qn_imag[i] * event_Qn_imag[i] - event_Qn_real[0]);
        Qn2_vector[i] += Q2_local;
        Qn2_vector_err[i] += Q2_local * Q2_local;
        for (int j = 0; j < npT; j++) {
            double QnSP_pT_local =
                (event_Qn_diff_real[i][j] * event_Qn_real[i]
                 + event_Qn_diff_imag[i][j] * event_Qn_imag[i]
                 - event_Qn_diff_real[0][j]);
            QnSP_diff_vector[i][j] += QnSP_pT_local;
            QnSP_diff_vector_err[i][j] += QnSP_pT_local * QnSP_pT_local;
        }
    }
}